

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

void __thiscall FxConstant::FxConstant(FxConstant *this,FString *str,FScriptPosition *pos)

{
  ExpVal EStack_28;
  
  FxExpression::FxExpression(&this->super_FxExpression,EFX_Constant,pos);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_00707480;
  (this->value).Type = (PType *)TypeSInt32;
  (this->value).field_1.Int = 0;
  (this->super_FxExpression).ValueType = (PType *)TypeString;
  ExpVal::ExpVal(&EStack_28,str);
  ExpVal::operator=(&this->value,&EStack_28);
  ExpVal::~ExpVal(&EStack_28);
  (this->super_FxExpression).isresolved = true;
  return;
}

Assistant:

FxConstant(const FString &str, const FScriptPosition &pos) : FxExpression(EFX_Constant, pos)
	{
		ValueType = TypeString;
		value = ExpVal(str);
		isresolved = true;
	}